

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::ReadListFile(cmMakefile *this,cmListFile *listFile,string *filenametoread)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  size_type sVar4;
  const_reference lff;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  cmExecutionStatus local_1bc;
  ulong uStack_1b8;
  cmExecutionStatus status;
  size_t i;
  size_t numberFunctions;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string currentFile;
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string currentParentFile;
  string *filenametoread_local;
  cmListFile *listFile_local;
  cmMakefile *this_local;
  
  currentParentFile.field_2._8_8_ = filenametoread;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_PARENT_LIST_FILE",&local_61);
  psVar2 = GetSafeDefinition(this,&local_60);
  std::__cxx11::string::string(local_40,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_CURRENT_LIST_FILE",&local_b9);
  psVar2 = GetSafeDefinition(this,&local_b8);
  std::__cxx11::string::string((string *)local_98,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"CMAKE_CURRENT_LIST_FILE",&local_e1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_e0,pcVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"CMAKE_CURRENT_LIST_DIR",&local_109);
  cmsys::SystemTools::GetFilenamePath(&local_130,(string *)currentParentFile.field_2._8_8_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_108,pcVar3);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"CMAKE_PARENT_LIST_FILE",&local_151);
  MarkVariableAsUsed(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"CMAKE_CURRENT_LIST_FILE",&local_179);
  MarkVariableAsUsed(this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"CMAKE_CURRENT_LIST_DIR",
             (allocator<char> *)((long)&numberFunctions + 7));
  MarkVariableAsUsed(this,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&numberFunctions + 7));
  sVar4 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                    (&listFile->Functions);
  for (uStack_1b8 = 0; uStack_1b8 < sVar4; uStack_1b8 = uStack_1b8 + 1) {
    cmExecutionStatus::cmExecutionStatus(&local_1bc);
    lff = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&listFile->Functions,uStack_1b8);
    ExecuteCommand(this,lff,&local_1bc);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if ((bVar1) || (bVar1 = cmExecutionStatus::GetReturnInvoked(&local_1bc), bVar1)) break;
  }
  CheckForUnusedVariables(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CMAKE_PARENT_LIST_FILE",&local_1e1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_1e0,pcVar3);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"CMAKE_CURRENT_LIST_FILE",&local_209);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_208,pcVar3);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"CMAKE_CURRENT_LIST_DIR",&local_231);
  cmsys::SystemTools::GetFilenamePath(&local_258,(string *)local_98);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_230,pcVar3);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"CMAKE_PARENT_LIST_FILE",&local_279);
  MarkVariableAsUsed(this,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"CMAKE_CURRENT_LIST_FILE",&local_2a1);
  MarkVariableAsUsed(this,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"CMAKE_CURRENT_LIST_DIR",&local_2c9);
  MarkVariableAsUsed(this,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmMakefile::ReadListFile(cmListFile const& listFile,
                              std::string const& filenametoread)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile =
    this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(filenametoread).c_str());

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for (size_t i = 0; i < numberFunctions; ++i) {
    cmExecutionStatus status;
    this->ExecuteCommand(listFile.Functions[i], status);
    if (cmSystemTools::GetFatalErrorOccured()) {
      break;
    }
    if (status.GetReturnInvoked()) {
      // Exit early due to return command.
      break;
    }
  }
  this->CheckForUnusedVariables();

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile).c_str());
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}